

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

void udiv_urem_bv(BtorSimBitVector *a,BtorSimBitVector *b,BtorSimBitVector **q,BtorSimBitVector **r)

{
  _Bool _Var1;
  uint64_t value;
  uint64_t uVar2;
  uint64_t value_00;
  BtorSimBitVector *b_00;
  BtorSimBitVector *bv;
  BtorSimBitVector *pBVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  BtorSimBitVector *local_60;
  
  uVar4 = a->width;
  if (uVar4 < 0x41) {
    value = btorsim_bv_to_uint64(a);
    uVar2 = btorsim_bv_to_uint64(b);
    if (uVar2 == 0) {
      value_00 = 0xffffffffffffffff;
    }
    else {
      value_00 = value / uVar2;
      value = value % uVar2;
    }
    local_60 = btorsim_bv_uint64_to_bv(value_00,uVar4);
    pBVar3 = btorsim_bv_uint64_to_bv(value,a->width);
  }
  else {
    b_00 = btorsim_bv_neg(b);
    local_60 = btorsim_bv_new(a->width);
    pBVar3 = btorsim_bv_new(a->width);
    for (uVar6 = (ulong)(a->width - 1); -1 < (long)uVar6; uVar6 = uVar6 - 1) {
      bv = sll_bv(pBVar3,1);
      free(pBVar3);
      uVar4 = (uint)uVar6 & 0x1f;
      uVar5 = ~((uint)(uVar6 >> 5) & 0x7ffffff);
      btorsim_bv_set_bit(bv,0,(uint)(((&a[1].width)[a->len + uVar5] >> uVar4 & 1) != 0));
      pBVar3 = btorsim_bv_ult(b,bv);
      _Var1 = btorsim_bv_is_true(pBVar3);
      free(pBVar3);
      if (_Var1) {
LAB_0011609c:
        pBVar3 = btorsim_bv_add(bv,b_00);
        free(bv);
        (&local_60[1].width)[uVar5 + local_60->len] =
             (&local_60[1].width)[uVar5 + local_60->len] | 1 << (sbyte)uVar4;
      }
      else {
        pBVar3 = btorsim_bv_eq(b,bv);
        _Var1 = btorsim_bv_is_true(pBVar3);
        free(pBVar3);
        pBVar3 = bv;
        if (_Var1) goto LAB_0011609c;
      }
    }
    free(b_00);
  }
  if (q == (BtorSimBitVector **)0x0) {
    free(local_60);
  }
  else {
    *q = local_60;
  }
  if (r != (BtorSimBitVector **)0x0) {
    *r = pBVar3;
    return;
  }
  free(pBVar3);
  return;
}

Assistant:

static void
udiv_urem_bv (const BtorSimBitVector *a,
              const BtorSimBitVector *b,
              BtorSimBitVector **q,
              BtorSimBitVector **r)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  int64_t i;
  bool is_true;
  uint64_t x, y, z;

  BtorSimBitVector *neg_b, *quot, *rem, *ult, *eq, *tmp;

  if (a->width <= 64)
  {
    x = btorsim_bv_to_uint64 (a);
    y = btorsim_bv_to_uint64 (b);
    if (y == 0)
    {
      y = x;
      x = UINT64_MAX;
    }
    else
    {
      z = x / y;
      y = x % y;
      x = z;
    }
    quot = btorsim_bv_uint64_to_bv (x, a->width);
    rem  = btorsim_bv_uint64_to_bv (y, a->width);
  }
  else
  {
    neg_b = btorsim_bv_neg (b);
    quot  = btorsim_bv_new (a->width);
    rem   = btorsim_bv_new (a->width);

    for (i = a->width - 1; i >= 0; i--)
    {
      tmp = sll_bv (rem, 1);
      free (rem);
      rem = tmp;
      btorsim_bv_set_bit (rem, 0, btorsim_bv_get_bit (a, i));

      ult     = btorsim_bv_ult (b, rem);
      is_true = btorsim_bv_is_true (ult);
      free (ult);

      if (is_true) goto UDIV_UREM_SUBTRACT;

      eq      = btorsim_bv_eq (b, rem);
      is_true = btorsim_bv_is_true (eq);
      free (eq);

      if (is_true)
      {
      UDIV_UREM_SUBTRACT:
        tmp = btorsim_bv_add (rem, neg_b);
        free (rem);
        rem = tmp;
        btorsim_bv_set_bit (quot, i, 1);
      }
    }
    free (neg_b);
  }

  if (q)
    *q = quot;
  else
    free (quot);

  if (r)
    *r = rem;
  else
    free (rem);
}